

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_font_multiline.cpp
# Opt level: O1

void __thiscall Prog::draw_text(Prog *this)

{
  List *pLVar1;
  ALLEGRO_FONT *pAVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  string *psVar8;
  ALLEGRO_FONT **ppAVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 in_XMM1_Da;
  undefined4 uVar12;
  ALLEGRO_FONT *local_50;
  float local_48;
  undefined4 local_44;
  int local_40;
  float local_3c;
  
  iVar3 = HSlider::get_cur_value(&this->width_slider);
  iVar4 = VSlider::get_cur_value(&this->height_slider);
  pcVar7 = TextEntry::get_text(&this->text_entry);
  pLVar1 = &this->text_font;
  psVar8 = List::get_selected_item_text_abi_cxx11_(pLVar1);
  iVar5 = std::__cxx11::string::compare((char *)psVar8);
  if (iVar5 == 0) {
    ppAVar9 = &font_ttf;
  }
  else {
    psVar8 = List::get_selected_item_text_abi_cxx11_(pLVar1);
    iVar5 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar5 == 0) {
      ppAVar9 = &font_bmp;
    }
    else {
      psVar8 = List::get_selected_item_text_abi_cxx11_(pLVar1);
      iVar5 = std::__cxx11::string::compare((char *)psVar8);
      if (iVar5 != 0) goto LAB_00107215;
      ppAVar9 = &font_bin;
    }
  }
  font = *ppAVar9;
LAB_00107215:
  pLVar1 = &this->text_align;
  psVar8 = List::get_selected_item_text_abi_cxx11_(pLVar1);
  iVar5 = std::__cxx11::string::compare((char *)psVar8);
  if (iVar5 == 0) {
    uVar10 = 4;
    iVar5 = 10;
  }
  else {
    psVar8 = List::get_selected_item_text_abi_cxx11_(pLVar1);
    iVar5 = std::__cxx11::string::compare((char *)psVar8);
    if (iVar5 == 0) {
      uVar10 = 5;
      iVar5 = iVar3 / 2 + 10;
    }
    else {
      psVar8 = List::get_selected_item_text_abi_cxx11_(pLVar1);
      iVar6 = std::__cxx11::string::compare((char *)psVar8);
      uVar10 = 6;
      if (iVar6 != 0) {
        uVar10 = 0;
      }
      iVar5 = 10;
      if (iVar6 == 0) {
        iVar5 = iVar3 + 10;
      }
    }
  }
  uVar11 = al_map_rgb(0xff,0,0);
  uVar12 = 0x42180000;
  al_draw_rectangle(0x41200000,0x42180000,(float)(iVar3 + 10),0x421c0000,uVar11,in_XMM1_Da,0);
  uVar11 = al_map_rgb(0,0xff,0);
  al_draw_line((float)iVar5,0x42200000,(float)iVar5,(float)(iVar4 + 0x28),uVar11,uVar12,0);
  pAVar2 = font;
  al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
  al_draw_multiline_text(pAVar2,uVar10,pcVar7);
  pAVar2 = font;
  al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
  al_draw_text(pAVar2,0,"Custom multiline text:");
  pAVar2 = font;
  iVar5 = this->tick;
  local_50 = font;
  local_44 = 0x42200000;
  local_48 = (float)(iVar3 + 10);
  iVar6 = al_get_font_line_height(font);
  local_3c = (float)(iVar6 + iVar4);
  local_40 = iVar5;
  al_do_multiline_text((float)iVar3,pAVar2,pcVar7,draw_custom_multiline_cb,&local_50);
  return;
}

Assistant:

void Prog::draw_text()
{
   int x  = 10, y  = 10;
   int sx = 10, sy = 10;
   int w = width_slider.get_cur_value();
   int h = height_slider.get_cur_value();
   int flags = 0;
   const char * text = text_entry.get_text();

   if (text_font.get_selected_item_text() == "Truetype") {
      font = font_ttf;
   } else if (text_font.get_selected_item_text() == "Bitmap") {
      font = font_bmp;
   } else if (text_font.get_selected_item_text() == "Builtin") {
      font = font_bin;
   }
   
   if (text_align.get_selected_item_text() == "Left") {
      flags = ALLEGRO_ALIGN_LEFT | ALLEGRO_ALIGN_INTEGER;
   } else if (text_align.get_selected_item_text() == "Center") {
      flags = ALLEGRO_ALIGN_CENTER | ALLEGRO_ALIGN_INTEGER;
      x = 10 + w / 2;
   } else if (text_align.get_selected_item_text() == "Right") {
      flags = ALLEGRO_ALIGN_RIGHT | ALLEGRO_ALIGN_INTEGER;
      x  = 10 + w;
   }
  

   /* Draw a red rectangle on the top with the requested width,
    * a blue rectangle around the real bounds of the text, 
    * a green line for the X axis location of drawing the text
    * and the line height, and finally the text itself.
    */
    
   al_draw_rectangle(sx, sy-2 + 30, sx + w, sy - 1 + 30, al_map_rgb(255, 0, 0), 0);
   al_draw_line(x, y + 30, x, y + h + 30, al_map_rgb(0, 255, 0), 0);
   al_draw_multiline_text(font, al_map_rgb_f(1, 1, 1), x, y + 30, w, h, flags, text);

   /* also do some custom bultiline drawing */
   al_draw_text(font, al_map_rgb_f(1, 1, 1), w + 10, y, 0, "Custom multiline text:" );
   draw_custom_multiline(font, w + 10 , y + 30, w, h, tick, text);
}